

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

void trb_print_parents(lysc_node *node,trt_wrapper *wr_in,trt_printer_ctx *pc,trt_tree_ctx *tc)

{
  trt_wrapper wr_00;
  uint32_t max_gap_before_type_00;
  trt_node local_120;
  trt_wrapper local_c0;
  undefined1 local_a8 [8];
  trt_node print_node;
  trt_wrapper wr;
  uint32_t max_gap_before_type;
  trt_tree_ctx *tc_local;
  trt_printer_ctx *pc_local;
  trt_wrapper *wr_in_local;
  lysc_node *node_local;
  
  if (((pc != (trt_printer_ctx *)0x0) && (tc != (trt_tree_ctx *)0x0)) &&
     (tc->section == TRD_SECT_MODULE)) {
    if (node != (lysc_node *)0x0) {
      trb_print_parents(node->parent,wr_in,pc,tc);
      tc->cn = node;
      trb_count_depth(&local_c0,wr_in,node);
      print_node._88_8_ = local_c0._0_8_;
      ly_print_(pc->out,"\n");
      (*(pc->fp).read.node)(&local_120,(trt_parent_cache)ZEXT816(0x1000400000000),tc);
      memcpy(local_a8,&local_120,0x60);
      print_node.iffeatures.str._0_1_ = 1;
      max_gap_before_type_00 = trb_max_gap_to_type((trt_parent_cache)ZEXT816(0x1000400000000),pc,tc)
      ;
      tc->cn = node;
      wr_00.bit_marks1 = local_c0.bit_marks1;
      wr_00._0_8_ = print_node._88_8_;
      wr_00.actual_pos = local_c0.actual_pos;
      wr_00._20_4_ = local_c0._20_4_;
      trb_print_entire_node((trt_node *)local_a8,max_gap_before_type_00,wr_00,pc,tc);
    }
    return;
  }
  __assert_fail("pc && tc && tc->section == TRD_SECT_MODULE",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_tree.c"
                ,0xe9e,
                "void trb_print_parents(const struct lysc_node *, struct trt_wrapper *, struct trt_printer_ctx *, struct trt_tree_ctx *)"
               );
}

Assistant:

static void
trb_print_parents(const struct lysc_node *node, struct trt_wrapper *wr_in, struct trt_printer_ctx *pc, struct trt_tree_ctx *tc)
{
    uint32_t max_gap_before_type;
    struct trt_wrapper wr;
    struct trt_node print_node;

    assert(pc && tc && tc->section == TRD_SECT_MODULE);

    /* stop recursion */
    if (!node) {
        return;
    }
    trb_print_parents(node->parent, wr_in, pc, tc);

    /* setup for printing */
    tc->cn = node;
    wr = trb_count_depth(wr_in, node);

    /* print node */
    ly_print_(pc->out, "\n");
    print_node = pc->fp.read.node(TRP_EMPTY_PARENT_CACHE, tc);
    /* siblings do not print, so the node is always considered the last */
    print_node.last_one = 1;
    max_gap_before_type = trb_max_gap_to_type(TRP_EMPTY_PARENT_CACHE, pc, tc);
    tc->cn = node;
    trb_print_entire_node(&print_node, max_gap_before_type, wr, pc, tc);
}